

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_timings::test_method(test_solvers_timings *this)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  lazy_ostream *prev;
  _func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  *local_a8;
  _func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  *local_a0 [3];
  basic_cstring<const_char> local_88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_78;
  basic_cstring<const_char> local_50;
  basic_cstring<const_char> local_40;
  _func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  *local_30;
  double local_28;
  double hungarian_timing;
  double local_18;
  double brute_force_timing;
  test_solvers_timings *this_local;
  
  brute_force_timing = (double)this;
  poVar3 = std::operator<<((ostream *)&std::cout,"Brute force method:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  hungarian_timing =
       (double)hungarian_algorithm::
               solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  local_18 = test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
                       ((_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                         **)&hungarian_timing,10);
  poVar3 = std::operator<<((ostream *)&std::cout,"Hungarian method:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_30 = hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  local_28 = test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
                       (&local_30,10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_40,0x1a4,&local_50);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_78,prev,(char (*) [1])0x140372);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
               ,100);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,double,double>
              (&local_78,&local_88,0x1a4,1,4,&local_28,"hungarian_timing",&local_18,
               "brute_force_timing");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_a0[0] = hungarian_algorithm::
                solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
            (local_a0,100);
  local_a8 = hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
            (&local_a8,200);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_timings)
{
  // These are informative only, and to check for any severe errors (segfaults, endless loops, ...):
  typedef int SolvingFunction(const ublas::matrix<int>&, const std::size_t, const std::size_t,
                              std::vector<std::size_t>&);
  std::cout << "Brute force method:" << std::endl;
  const double brute_force_timing = test_solver_timing(
    static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), 10);
  std::cout << "Hungarian method:" << std::endl;
  const double hungarian_timing = test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 10);
  BOOST_CHECK_LT(hungarian_timing, brute_force_timing);
  test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 100);
  test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 200);
}